

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

int64_t __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::get_int64_value(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                  *this,error_code *ec)

{
  size_t sVar1;
  byte *pbVar2;
  byte *pbVar3;
  size_t sVar4;
  bool bVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  byte *pbVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  long lVar13;
  uint8_t buf_2 [2];
  uint8_t buf [4];
  uint8_t buf_1 [8];
  
  puVar8 = &stack0xfffffffffffffff0;
  pbVar2 = (this->source_).current_.p_;
  pbVar3 = (this->source_).end_.p_;
  if (pbVar2 != pbVar3) {
    bVar11 = *pbVar2 >> 5;
    if (bVar11 == 0) {
      uVar6 = get_uint64_value(this,ec);
      if (ec->_M_value != 0) {
        return 0;
      }
      if (0 < (long)uVar6) {
        return uVar6;
      }
      return 0;
    }
    if (bVar11 != 1) {
      return 0;
    }
    bVar11 = *pbVar2 & 0x1f;
    sVar4 = (this->source_).position_;
    sVar1 = sVar4 + 1;
    (this->source_).position_ = sVar1;
    pbVar9 = pbVar2 + 1;
    (this->source_).current_.p_ = pbVar9;
    switch(bVar11) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
      return (long)(char)~bVar11;
    case 0x18:
      if (pbVar9 != pbVar3) {
        uVar7 = (ulong)pbVar2[1];
        (this->source_).current_.p_ = pbVar2 + 2;
        (this->source_).position_ = sVar4 + 2;
LAB_0016e00b:
        return ~uVar7;
      }
      (this->source_).position_ = sVar1;
      break;
    case 0x19:
      puVar8 = buf_2;
      lVar10 = 0;
      bVar5 = true;
      do {
        bVar12 = bVar5;
        lVar13 = lVar10;
        if (pbVar9 == pbVar3) goto LAB_0016dfaa;
        buf_2[lVar13] = *pbVar9;
        pbVar9 = pbVar9 + 1;
        (this->source_).current_.p_ = pbVar9;
        puVar8 = buf_2 + 1;
        lVar10 = 1;
        bVar5 = false;
      } while (bVar12);
      puVar8 = buf_2 + lVar13 + 1;
LAB_0016dfaa:
      (this->source_).position_ = sVar1 + ((long)puVar8 - (long)buf_2);
      if ((long)puVar8 - (long)buf_2 == 2) {
        uVar7 = (ulong)(ushort)((short)buf_2 << 8 | (ushort)buf_2 >> 8);
        goto LAB_0016e00b;
      }
      break;
    case 0x1a:
      lVar10 = 0;
      do {
        if (pbVar9 == pbVar3) {
          puVar8 = buf + lVar10;
          goto LAB_0016dff0;
        }
        buf[lVar10] = *pbVar9;
        lVar10 = lVar10 + 1;
        pbVar9 = pbVar9 + 1;
        (this->source_).current_.p_ = pbVar9;
      } while (lVar10 != 4);
      puVar8 = buf_1;
LAB_0016dff0:
      (this->source_).position_ = sVar1 + ((long)puVar8 - (long)buf);
      if ((long)puVar8 - (long)buf == 4) {
        uVar7 = (ulong)((uint)buf >> 0x18 | ((uint)buf & 0xff0000) >> 8 | ((uint)buf & 0xff00) << 8
                       | (int)buf << 0x18);
        goto LAB_0016e00b;
      }
      break;
    case 0x1b:
      lVar10 = 0;
      do {
        if (pbVar9 == pbVar3) {
          puVar8 = buf_1 + lVar10;
          break;
        }
        buf_1[lVar10] = *pbVar9;
        lVar10 = lVar10 + 1;
        pbVar9 = pbVar9 + 1;
        (this->source_).current_.p_ = pbVar9;
      } while (lVar10 != 8);
      (this->source_).position_ = sVar1 + ((long)puVar8 - (long)buf_1);
      if ((long)puVar8 - (long)buf_1 == 8) {
        uVar7 = ~(ulong)buf_1;
        return uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
               | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 |
               (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      }
      break;
    default:
      goto LAB_0016e04f;
    }
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
LAB_0016e04f:
  return 0;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }